

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
::
nosize_unchecked_emplace_at<std::pair<slang::syntax::SyntaxNode_const*&&,slang::ast::Compilation::SyntaxMetadata&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::syntax::SyntaxNode_*&&,_slang::ast::Compilation::SyntaxMetadata_&&>
          *args)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  SyntaxMetadata *pSVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  SyntaxTree *pSVar8;
  NetType *pNVar9;
  undefined3 uVar10;
  UnconnectedDrive UVar11;
  bool bVar12;
  undefined3 uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pgVar3 = arrays_->groups_;
  lVar14 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar17[0] = -(pgVar1->m[0].n == '\0');
  auVar17[1] = -(pgVar1->m[1].n == '\0');
  auVar17[2] = -(pgVar1->m[2].n == '\0');
  auVar17[3] = -(pgVar1->m[3].n == '\0');
  auVar17[4] = -(pgVar1->m[4].n == '\0');
  auVar17[5] = -(pgVar1->m[5].n == '\0');
  auVar17[6] = -(pgVar1->m[6].n == '\0');
  auVar17[7] = -(pgVar1->m[7].n == '\0');
  auVar17[8] = -(pgVar1->m[8].n == '\0');
  auVar17[9] = -(pgVar1->m[9].n == '\0');
  auVar17[10] = -(pgVar1->m[10].n == '\0');
  auVar17[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar17[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar17[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar17[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar17[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar16 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
  if (uVar16 == 0) {
    uVar5 = arrays_->groups_size_mask;
    lVar15 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar15 & uVar5;
      lVar14 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar18[0] = -(pgVar1->m[0].n == '\0');
      auVar18[1] = -(pgVar1->m[1].n == '\0');
      auVar18[2] = -(pgVar1->m[2].n == '\0');
      auVar18[3] = -(pgVar1->m[3].n == '\0');
      auVar18[4] = -(pgVar1->m[4].n == '\0');
      auVar18[5] = -(pgVar1->m[5].n == '\0');
      auVar18[6] = -(pgVar1->m[6].n == '\0');
      auVar18[7] = -(pgVar1->m[7].n == '\0');
      auVar18[8] = -(pgVar1->m[8].n == '\0');
      auVar18[9] = -(pgVar1->m[9].n == '\0');
      auVar18[10] = -(pgVar1->m[10].n == '\0');
      auVar18[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar18[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar18[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar18[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar18[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar7 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe;
      uVar16 = (uint)uVar7;
      lVar15 = lVar15 + 1;
    } while (uVar7 == 0);
  }
  uVar6 = 0;
  if (uVar16 != 0) {
    for (; (uVar16 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar6;
  ppVar2->first = *args->first;
  pSVar4 = args->second;
  pSVar8 = pSVar4->tree;
  pNVar9 = pSVar4->defaultNetType;
  uVar10 = *(undefined3 *)&pSVar4->field_0x15;
  UVar11 = pSVar4->unconnectedDrive;
  bVar12 = pSVar4->cellDefine;
  uVar13 = *(undefined3 *)&pSVar4->field_0x1d;
  (ppVar2->second).timeScale =
       (_Optional_base<slang::TimeScale,_true,_true>)
       (pSVar4->timeScale).super__Optional_base<slang::TimeScale,_true,_true>;
  *(undefined3 *)&(ppVar2->second).field_0x15 = uVar10;
  (ppVar2->second).unconnectedDrive = UVar11;
  (ppVar2->second).cellDefine = bVar12;
  *(undefined3 *)&(ppVar2->second).field_0x1d = uVar13;
  (ppVar2->second).tree = pSVar8;
  (ppVar2->second).defaultNetType = pNVar9;
  (pgVar3->m + lVar14)[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar14);
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }